

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O3

Vec_Ptr_t * Abs_ManTernarySimulate(Aig_Man_t *p,int nFramesMax,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  byte bVar2;
  int iVar3;
  Vec_Ptr_t *vSimInfo;
  void **ppvVar4;
  void *pvVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  void **ppvVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  char *__format;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  double dVar16;
  timespec ts;
  timespec local_50;
  ulong local_40;
  size_t local_38;
  
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmc2.c"
                  ,0xce,"Vec_Ptr_t *Abs_ManTernarySimulate(Aig_Man_t *, int, int)");
  }
  uVar6 = p->vObjs->nSize - p->nDeleted;
  ppvVar4 = (void **)0x0;
  uVar14 = (int)(800000000 / (long)(int)uVar6) + 1;
  if (nFramesMax <= (int)uVar14) {
    uVar14 = nFramesMax;
  }
  vSimInfo = (Vec_Ptr_t *)malloc(0x10);
  uVar7 = 8;
  if (6 < uVar14 - 1) {
    uVar7 = uVar14;
  }
  vSimInfo->nSize = 0;
  vSimInfo->nCap = uVar7;
  if (uVar7 != 0) {
    ppvVar4 = (void **)malloc((long)(int)uVar7 << 3);
  }
  vSimInfo->pArray = ppvVar4;
  if (0 < (int)uVar14) {
    local_38 = (size_t)(int)((((int)uVar6 >> 4) + 1) - (uint)((uVar6 & 0xf) == 0));
    local_40 = (ulong)uVar14;
    uVar15 = 0;
    do {
      pvVar5 = calloc(local_38,4);
      uVar6 = vSimInfo->nSize;
      if (uVar6 == vSimInfo->nCap) {
        if ((int)uVar6 < 0x10) {
          if (vSimInfo->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vSimInfo->pArray,0x80);
          }
          vSimInfo->pArray = ppvVar4;
          vSimInfo->nCap = 0x10;
        }
        else {
          if (vSimInfo->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar6 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(vSimInfo->pArray,(ulong)uVar6 << 4);
          }
          vSimInfo->pArray = ppvVar4;
          vSimInfo->nCap = uVar6 * 2;
        }
      }
      else {
        ppvVar4 = vSimInfo->pArray;
      }
      iVar3 = vSimInfo->nSize;
      iVar8 = iVar3 + 1;
      vSimInfo->nSize = iVar8;
      ppvVar4[iVar3] = pvVar5;
      if (uVar15 == 0) {
        if (0 < p->nRegs) {
          pVVar1 = p->vCis;
          iVar3 = 0;
          do {
            uVar6 = p->nTruePis + iVar3;
            if ((((int)uVar6 < 0) || (pVVar1->nSize <= (int)uVar6)) || (vSimInfo->nSize < 1))
            goto LAB_0050ed6f;
            iVar8 = *(int *)((long)pVVar1->pArray[uVar6] + 0x24);
            lVar11 = (long)(iVar8 >> 4);
            uVar6 = *(uint *)((long)*vSimInfo->pArray + lVar11 * 4);
            bVar2 = (char)iVar8 * '\x02';
            *(uint *)((long)*vSimInfo->pArray + lVar11 * 4) =
                 (uVar6 >> (bVar2 & 0x1f) & 3 ^ 1) << (bVar2 & 0x1f) ^ uVar6;
            iVar3 = iVar3 + 1;
          } while (iVar3 < p->nRegs);
          iVar8 = vSimInfo->nSize;
        }
        if (iVar8 < 1) goto LAB_0050ed6f;
        ppvVar4 = vSimInfo->pArray;
        ppvVar9 = ppvVar4;
      }
      else {
        if ((long)iVar3 < (long)uVar15) {
LAB_0050ed6f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        ppvVar4 = vSimInfo->pArray;
        ppvVar9 = ppvVar4 + uVar15;
      }
      iVar3 = p->pConst1->Id;
      lVar11 = (long)(iVar3 >> 4);
      uVar6 = *(uint *)((long)*ppvVar9 + lVar11 * 4);
      bVar2 = (char)iVar3 * '\x02';
      *(uint *)((long)*ppvVar9 + lVar11 * 4) =
           (uVar6 >> (bVar2 & 0x1f) & 3 ^ 2) << (bVar2 & 0x1f) ^ uVar6;
      if (0 < p->nTruePis) {
        pVVar1 = p->vCis;
        lVar11 = 0;
        do {
          if ((pVVar1->nSize <= lVar11) || ((long)vSimInfo->nSize <= (long)uVar15))
          goto LAB_0050ed6f;
          iVar3 = *(int *)((long)pVVar1->pArray[lVar11] + 0x24);
          lVar13 = (long)(iVar3 >> 4);
          uVar6 = *(uint *)((long)ppvVar4[uVar15] + lVar13 * 4);
          bVar2 = (char)iVar3 * '\x02';
          *(uint *)((long)ppvVar4[uVar15] + lVar13 * 4) =
               (~(uVar6 >> (bVar2 & 0x1f)) & 3) << (bVar2 & 0x1f) ^ uVar6;
          lVar11 = lVar11 + 1;
        } while (lVar11 < p->nTruePis);
      }
      if (0 < p->nTruePos) {
        lVar11 = 0;
        do {
          if (p->vCos->nSize <= lVar11) goto LAB_0050ed6f;
          Abs_ManExtendOneEval_rec(vSimInfo,p,(Aig_Obj_t *)p->vCos->pArray[lVar11],(int)uVar15);
          lVar11 = lVar11 + 1;
          iVar3 = p->nTruePos;
        } while (lVar11 < iVar3);
        if (0 < iVar3) {
          uVar6 = p->vCos->nSize;
          if ((int)uVar6 < 1) {
            uVar6 = 0;
          }
          uVar12 = 0;
          do {
            if ((uVar6 == uVar12) || ((long)vSimInfo->nSize <= (long)uVar15)) goto LAB_0050ed6f;
            iVar8 = *(int *)((long)p->vCos->pArray[uVar12] + 0x24);
            if ((*(uint *)((long)vSimInfo->pArray[uVar15] + (long)(iVar8 >> 4) * 4) >>
                 ((char)iVar8 * '\x02' & 0x1fU) & 3) != 1) {
              if (fVerbose == 0) {
                return vSimInfo;
              }
              dVar16 = (double)(p->vObjs->nSize - p->nDeleted) * (double)((int)uVar15 + 1) * 0.25;
              __format = "Ternary sim found non-zero output in frame %d.  Used %5.2f MB.  ";
              uVar15 = uVar15 & 0xffffffff;
              goto LAB_0050ecd6;
            }
            uVar12 = uVar12 + 1;
          } while ((long)iVar3 != uVar12);
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != local_40);
  }
  if (fVerbose != 0) {
    dVar16 = (double)(p->vObjs->nSize - p->nDeleted) * (double)(int)uVar14 * 0.25;
    __format = "Ternary sim proved all outputs in the first %d frames.  Used %5.2f MB.  ";
    uVar15 = (ulong)uVar14;
LAB_0050ecd6:
    printf(__format,dVar16 * 9.5367431640625e-07,uVar15);
    Abc_Print((int)__format,"%s =","Time");
    iVar8 = 3;
    iVar3 = clock_gettime(3,&local_50);
    if (iVar3 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar10 + lVar11) / 1000000.0);
  }
  return vSimInfo;
}

Assistant:

Vec_Ptr_t * Abs_ManTernarySimulate( Aig_Man_t * p, int nFramesMax, int fVerbose )
{
    Vec_Ptr_t * vSimInfo;
    Aig_Obj_t * pObj;
    int i, f, nFramesLimit, nFrameWords;
    abctime clk = Abc_Clock();
    assert( Aig_ManRegNum(p) > 0 );
    // the maximum number of frames will be determined to use at most 200Mb of RAM
    nFramesLimit = 1 + (200000000 * 4)/Aig_ManObjNum(p);
    nFramesLimit = Abc_MinInt( nFramesLimit, nFramesMax );
    nFrameWords  = Abc_BitWordNum( 2 * Aig_ManObjNum(p) );
    // allocate simulation info
    vSimInfo = Vec_PtrAlloc( nFramesLimit );
    for ( f = 0; f < nFramesLimit; f++ )
    {
        Vec_PtrPush( vSimInfo, ABC_CALLOC(unsigned, nFrameWords) );
        if ( f == 0 ) 
        {
            Saig_ManForEachLo( p, pObj, i )
                Abs_ManSimInfoSet( vSimInfo, pObj, 0, ABS_ZER );
        }
        Abs_ManSimInfoSet( vSimInfo, Aig_ManConst1(p), f, ABS_ONE );
        Saig_ManForEachPi( p, pObj, i )
            Abs_ManSimInfoSet( vSimInfo, pObj, f, ABS_UND );
        Saig_ManForEachPo( p, pObj, i )
            Abs_ManExtendOneEval_rec( vSimInfo, p, pObj, f );
        // check if simulation has derived at least one fail or unknown
        Saig_ManForEachPo( p, pObj, i )
            if ( Abs_ManSimInfoGet(vSimInfo, pObj, f) != ABS_ZER )
            {
                if ( fVerbose )
                {
                    printf( "Ternary sim found non-zero output in frame %d.  Used %5.2f MB.  ", 
                        f, 0.25 * (f+1) * Aig_ManObjNum(p) / (1<<20) );
                    ABC_PRT( "Time", Abc_Clock() - clk );
                }
                return vSimInfo;
            }
    }
    if ( fVerbose )
    {
        printf( "Ternary sim proved all outputs in the first %d frames.  Used %5.2f MB.  ", 
            nFramesLimit, 0.25 * nFramesLimit * Aig_ManObjNum(p) / (1<<20) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    return vSimInfo;
}